

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

IdMap * __thiscall
libcellml::Validator::ValidatorImpl::buildModelIdMap_abi_cxx11_
          (IdMap *__return_storage_ptr__,ValidatorImpl *this,ModelPtr *model)

{
  size_t *info_00;
  IssueImpl *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  byte bVar2;
  bool bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *peVar6;
  size_t sVar7;
  ulong uVar8;
  element_type *peVar9;
  element_type *peVar10;
  element_type *peVar11;
  byte local_731;
  ComponentEntity local_6b8;
  ulong local_6a8;
  size_t c;
  string local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  string local_620;
  string local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  undefined1 local_560 [8];
  IssuePtr issue;
  string local_530;
  ImportedEntity local_510;
  string local_500;
  string local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  byte local_47a;
  byte local_479;
  ImportedEntity local_478;
  string local_468;
  ImportedEntity local_448;
  string local_438;
  string local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  undefined1 local_378 [8];
  string id;
  double multiplier;
  double exponent;
  string prefix;
  string reference;
  size_t i;
  string local_2e0;
  string local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  undefined1 local_140 [8];
  UnitsPtr units;
  size_t u;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_98;
  undefined1 local_78 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reportedConnections;
  string info;
  ModelPtr *model_local;
  ValidatorImpl *this_local;
  IdMap *idMap;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::map(__return_storage_ptr__);
  std::__cxx11::string::string
            ((string *)&reportedConnections._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_78);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)model);
  Entity::id_abi_cxx11_(&local_98,(Entity *)peVar4);
  bVar2 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_98);
  if (((bVar2 ^ 0xff) & 1) != 0) {
    peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)model);
    NamedEntity::name_abi_cxx11_(&local_108,(NamedEntity *)peVar4);
    std::operator+(&local_e8," - model \'",&local_108);
    std::operator+(&local_c8,&local_e8,"\'");
    std::__cxx11::string::operator=
              ((string *)&reportedConnections._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)model);
    Entity::id_abi_cxx11_((string *)&u,(Entity *)peVar4);
    addIdMapItem(this,(string *)&u,
                 (string *)&reportedConnections._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 __return_storage_ptr__);
    std::__cxx11::string::~string((string *)&u);
  }
  units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    _Var1._M_pi = units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
    peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)model);
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Model::unitsCount(peVar4);
    if (p_Var5 <= _Var1._M_pi) break;
    peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)model);
    Model::units((Model *)local_140,(size_t)peVar4);
    peVar6 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_140);
    Entity::id_abi_cxx11_(&local_160,(Entity *)peVar6);
    bVar2 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_160);
    if (((bVar2 ^ 0xff) & 1) != 0) {
      peVar6 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_140);
      bVar3 = ImportedEntity::isImport(&peVar6->super_ImportedEntity);
      if (bVar3) {
        peVar6 = std::
                 __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_140);
        NamedEntity::name_abi_cxx11_(&local_200,&peVar6->super_NamedEntity);
        std::operator+(&local_1e0," - imported units \'",&local_200);
        std::operator+(&local_1c0,&local_1e0,"\' in model \'");
        peVar4 = std::
                 __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)model);
        NamedEntity::name_abi_cxx11_(&local_220,(NamedEntity *)peVar4);
        std::operator+(&local_1a0,&local_1c0,&local_220);
        std::operator+(&local_180,&local_1a0,"\'");
        std::__cxx11::string::operator=
                  ((string *)&reportedConnections._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (string *)&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_200);
      }
      else {
        peVar6 = std::
                 __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_140);
        NamedEntity::name_abi_cxx11_(&local_2c0,&peVar6->super_NamedEntity);
        std::operator+(&local_2a0," - units \'",&local_2c0);
        std::operator+(&local_280,&local_2a0,"\' in model \'");
        peVar4 = std::
                 __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)model);
        NamedEntity::name_abi_cxx11_(&local_2e0,(NamedEntity *)peVar4);
        std::operator+(&local_260,&local_280,&local_2e0);
        std::operator+(&local_240,&local_260,"\'");
        std::__cxx11::string::operator=
                  ((string *)&reportedConnections._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (string *)&local_240);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::__cxx11::string::~string((string *)&local_280);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::string::~string((string *)&local_2c0);
      }
      peVar6 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_140);
      Entity::id_abi_cxx11_((string *)&i,(Entity *)peVar6);
      addIdMapItem(this,(string *)&i,
                   (string *)&reportedConnections._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   __return_storage_ptr__);
      std::__cxx11::string::~string((string *)&i);
    }
    reference.field_2._8_8_ = 0;
    while( true ) {
      peVar6 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_140);
      sVar7 = Units::unitCount(peVar6);
      if (sVar7 <= (ulong)reference.field_2._8_8_) break;
      std::__cxx11::string::string((string *)(prefix.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)&exponent);
      std::__cxx11::string::string((string *)local_378);
      peVar6 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_140);
      Units::unitAttributes
                (peVar6,reference.field_2._8_8_,(string *)(prefix.field_2._M_local_buf + 8),
                 (string *)&exponent,&multiplier,(double *)((long)&id.field_2 + 8),
                 (string *)local_378);
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        peVar6 = std::
                 __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_140);
        NamedEntity::name_abi_cxx11_(&local_418,&peVar6->super_NamedEntity);
        std::operator+(&local_3f8," - unit in units \'",&local_418);
        std::operator+(&local_3d8,&local_3f8,"\' in model \'");
        peVar4 = std::
                 __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)model);
        NamedEntity::name_abi_cxx11_(&local_438,(NamedEntity *)peVar4);
        std::operator+(&local_3b8,&local_3d8,&local_438);
        std::operator+(&local_398,&local_3b8,"\'");
        info_00 = &reportedConnections._M_t._M_impl.super__Rb_tree_header._M_node_count;
        std::__cxx11::string::operator=((string *)info_00,(string *)&local_398);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::string::~string((string *)&local_3d8);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_418);
        addIdMapItem(this,(string *)local_378,(string *)info_00,__return_storage_ptr__);
      }
      std::__cxx11::string::~string((string *)local_378);
      std::__cxx11::string::~string((string *)&exponent);
      std::__cxx11::string::~string((string *)(prefix.field_2._M_local_buf + 8));
      reference.field_2._8_8_ = reference.field_2._8_8_ + 1;
    }
    std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_140);
    local_479 = 0;
    local_47a = 0;
    ImportedEntity::importSource(&local_448);
    bVar3 = std::operator!=((shared_ptr<libcellml::ImportSource> *)&local_448,(nullptr_t)0x0);
    local_731 = 0;
    if (bVar3) {
      std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 local_140);
      ImportedEntity::importSource(&local_478);
      local_479 = 1;
      peVar9 = std::
               __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_478);
      Entity::id_abi_cxx11_(&local_468,&peVar9->super_Entity);
      local_47a = 1;
      local_731 = std::__cxx11::string::empty();
      local_731 = local_731 ^ 0xff;
    }
    if ((local_47a & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_468);
    }
    if ((local_479 & 1) != 0) {
      std::shared_ptr<libcellml::ImportSource>::~shared_ptr
                ((shared_ptr<libcellml::ImportSource> *)&local_478);
    }
    std::shared_ptr<libcellml::ImportSource>::~shared_ptr
              ((shared_ptr<libcellml::ImportSource> *)&local_448);
    if ((local_731 & 1) != 0) {
      peVar6 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_140);
      NamedEntity::name_abi_cxx11_(&local_4e0,&peVar6->super_NamedEntity);
      std::operator+(&local_4c0," - import source for units \'",&local_4e0);
      std::operator+(&local_4a0,&local_4c0,"\'");
      std::__cxx11::string::operator=
                ((string *)&reportedConnections._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (string *)&local_4a0);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 local_140);
      ImportedEntity::importSource(&local_510);
      peVar9 = std::
               __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_510);
      Entity::id_abi_cxx11_(&local_500,&peVar9->super_Entity);
      addIdMapItem(this,&local_500,
                   (string *)&reportedConnections._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   __return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_500);
      std::shared_ptr<libcellml::ImportSource>::~shared_ptr
                ((shared_ptr<libcellml::ImportSource> *)&local_510);
    }
    std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_140);
    units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_vptr__Sp_counted_base + 1);
  }
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)model);
  ComponentEntity::encapsulationId_abi_cxx11_(&local_530,&peVar4->super_ComponentEntity);
  bVar2 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_530);
  if (((bVar2 ^ 0xff) & 1) != 0) {
    peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)model);
    ComponentEntity::encapsulationId_abi_cxx11_
              ((string *)
               &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &peVar4->super_ComponentEntity);
    bVar3 = isValidXmlName((string *)
                           &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
    std::__cxx11::string::~string
              ((string *)
               &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      Issue::IssueImpl::create();
      peVar10 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_560);
      Issue::IssueImpl::setReferenceRule(peVar10->mPimpl,XML_ID_ATTRIBUTE);
      peVar10 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_560);
      peVar11 = std::
                __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&peVar10->mPimpl->mItem);
      AnyCellmlElement::AnyCellmlElementImpl::setModel(peVar11->mPimpl,model,MODEL);
      peVar10 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_560);
      this_00 = peVar10->mPimpl;
      peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)model);
      NamedEntity::name_abi_cxx11_(&local_600,(NamedEntity *)peVar4);
      std::operator+(&local_5e0,"Model \'",&local_600);
      std::operator+(&local_5c0,&local_5e0,
                     "\' does not have a valid encapsulation \'id\' attribute, \'");
      peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)model);
      ComponentEntity::encapsulationId_abi_cxx11_(&local_620,&peVar4->super_ComponentEntity);
      std::operator+(&local_5a0,&local_5c0,&local_620);
      std::operator+(&local_580,&local_5a0,"\'.");
      Issue::IssueImpl::setDescription(this_00,&local_580);
      std::__cxx11::string::~string((string *)&local_580);
      std::__cxx11::string::~string((string *)&local_5a0);
      std::__cxx11::string::~string((string *)&local_620);
      std::__cxx11::string::~string((string *)&local_5c0);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::__cxx11::string::~string((string *)&local_600);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_560);
      std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_560);
    }
    peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)model);
    NamedEntity::name_abi_cxx11_(&local_680,(NamedEntity *)peVar4);
    std::operator+(&local_660," - encapsulation in model \'",&local_680);
    std::operator+(&local_640,&local_660,"\'");
    std::__cxx11::string::operator=
              ((string *)&reportedConnections._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (string *)&local_640);
    std::__cxx11::string::~string((string *)&local_640);
    std::__cxx11::string::~string((string *)&local_660);
    std::__cxx11::string::~string((string *)&local_680);
    peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)model);
    ComponentEntity::encapsulationId_abi_cxx11_((string *)&c,&peVar4->super_ComponentEntity);
    addIdMapItem(this,(string *)&c,
                 (string *)&reportedConnections._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 __return_storage_ptr__);
    std::__cxx11::string::~string((string *)&c);
  }
  local_6a8 = 0;
  while( true ) {
    uVar8 = local_6a8;
    peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)model);
    sVar7 = ComponentEntity::componentCount(&peVar4->super_ComponentEntity);
    if (sVar7 <= uVar8) break;
    peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)model);
    ComponentEntity::component(&local_6b8,(size_t)peVar4);
    buildComponentIdMap(this,(ComponentPtr *)&local_6b8,__return_storage_ptr__,
                        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_78);
    std::shared_ptr<libcellml::Component>::~shared_ptr
              ((shared_ptr<libcellml::Component> *)&local_6b8);
    local_6a8 = local_6a8 + 1;
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_78);
  std::__cxx11::string::~string
            ((string *)&reportedConnections._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return __return_storage_ptr__;
}

Assistant:

IdMap Validator::ValidatorImpl::buildModelIdMap(const ModelPtr &model)
{
    IdMap idMap;
    std::string info;
    std::set<std::string> reportedConnections;
    // Model.
    if (!model->id().empty()) {
        info = " - model '" + model->name() + "'";
        addIdMapItem(model->id(), info, idMap);
    }

    // Units.
    for (size_t u = 0; u < model->unitsCount(); ++u) {
        auto units = model->units(u);
        if (!units->id().empty()) {
            if (units->isImport()) {
                info = " - imported units '" + units->name() + "' in model '" + model->name() + "'";
            } else {
                info = " - units '" + units->name() + "' in model '" + model->name() + "'";
            }
            addIdMapItem(units->id(), info, idMap);
        }
        for (size_t i = 0; i < units->unitCount(); ++i) {
            std::string reference;
            std::string prefix;
            double exponent;
            double multiplier;
            std::string id;
            units->unitAttributes(i, reference, prefix, exponent, multiplier, id);
            if (!id.empty()) {
                info = " - unit in units '" + units->name() + "' in model '" + model->name() + "'";
                addIdMapItem(id, info, idMap);
            }
        }
        if ((units->importSource() != nullptr) && !units->importSource()->id().empty()) {
            info = " - import source for units '" + units->name() + "'";
            addIdMapItem(units->importSource()->id(), info, idMap);
        }
    }
    // Encapsulation.
    if (!model->encapsulationId().empty()) {
        // Check for a valid identifier.
        if (!isValidXmlName(model->encapsulationId())) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);
            issue->mPimpl->mItem->mPimpl->setModel(model);
            issue->mPimpl->setDescription("Model '" + model->name() + "' does not have a valid encapsulation 'id' attribute, '" + model->encapsulationId() + "'.");
            addIssue(issue);
        }

        info = " - encapsulation in model '" + model->name() + "'";
        addIdMapItem(model->encapsulationId(), info, idMap);
    }

    // Start recursion through encapsulation hierarchy.
    for (size_t c = 0; c < model->componentCount(); ++c) {
        buildComponentIdMap(model->component(c), idMap, reportedConnections);
    }
    return idMap;
}